

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pid.c
# Opt level: O0

double * specific_info(int *stimulus,int *responses,size_t l,size_t n,int bs,int *br,size_t *source,
                      inform_dist *s_dist,inform_error *err)

{
  ulong l_00;
  _Bool _Var1;
  int *series;
  long lVar2;
  size_t capacity;
  gvector v;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  int local_f8;
  int local_f4;
  int r;
  int s;
  double n_joint;
  double n_response;
  double n_stimulus;
  int joint;
  double *si;
  size_t i_3;
  inform_dist r_dist;
  inform_dist j_dist;
  size_t i_2;
  uint32_t *data;
  size_t total_size;
  size_t r_size;
  size_t j_size;
  size_t i_1;
  ulong uStack_58;
  int b;
  size_t i;
  int *box;
  size_t u;
  int *br_local;
  int bs_local;
  size_t n_local;
  size_t l_local;
  int *responses_local;
  int *stimulus_local;
  
  l_00 = source[-1];
  series = (int *)gvector_alloc((l_00 + 1) * n,(l_00 + 1) * n,4);
  if (series == (int *)0x0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_ENOMEM;
    }
    stimulus_local = (int *)0x0;
  }
  else {
    for (uStack_58 = 0; uStack_58 < l_00; uStack_58 = uStack_58 + 1) {
      memcpy(series + uStack_58 * n,responses + source[uStack_58] * n,n << 2);
    }
    inform_black_box(series,l_00,1,n,br,(size_t *)0x0,(size_t *)0x0,series + l_00 * n,err);
    _Var1 = inform_failed(err);
    if (_Var1) {
      gvector_free(series);
      stimulus_local = (int *)0x0;
    }
    else {
      i_1._4_4_ = 1;
      for (j_size = 0; j_size < l_00; j_size = j_size + 1) {
        i_1._4_4_ = br[source[j_size]] * i_1._4_4_;
      }
      lVar2 = (long)(bs * i_1._4_4_);
      capacity = lVar2 + i_1._4_4_;
      v = gvector_alloc(capacity,capacity,4);
      if (v == (gvector)0x0) {
        gvector_free(series);
        if (err != (inform_error *)0x0) {
          *err = INFORM_ENOMEM;
        }
        stimulus_local = (int *)0x0;
      }
      else {
        for (j_dist.counts = 0; j_dist.counts < capacity; j_dist.counts = j_dist.counts + 1) {
          *(undefined4 *)((long)v + j_dist.counts * 4) = 0;
        }
        for (si = (double *)0x0; si < n; si = (double *)((long)si + 1)) {
          *(int *)((long)v + (long)series[(long)(l_00 * n + (long)si)] * 4 + lVar2 * 4) =
               *(int *)((long)v + (long)series[(long)(l_00 * n + (long)si)] * 4 + lVar2 * 4) + 1;
          lVar3 = (long)(stimulus[(long)si] + bs * series[(long)(l_00 * n + (long)si)]);
          *(int *)((long)v + lVar3 * 4) = *(int *)((long)v + lVar3 * 4) + 1;
        }
        stimulus_local = (int *)gvector_alloc((long)bs,(long)bs,8);
        if (stimulus_local == (int *)0x0) {
          gvector_free(v);
          gvector_free(series);
          if (err != (inform_error *)0x0) {
            *err = INFORM_ENOMEM;
          }
          stimulus_local = (int *)0x0;
        }
        else {
          for (local_f4 = 0; local_f4 < bs; local_f4 = local_f4 + 1) {
            (stimulus_local + (long)local_f4 * 2)[0] = 0;
            (stimulus_local + (long)local_f4 * 2)[1] = 0;
            dVar4 = (double)s_dist->histogram[local_f4];
            if ((dVar4 != 0.0) || (NAN(dVar4))) {
              for (local_f8 = 0; local_f8 < i_1._4_4_; local_f8 = local_f8 + 1) {
                dVar5 = (double)*(uint *)((long)v + (long)local_f8 * 4 + lVar2 * 4);
                if ((dVar5 != 0.0) || (NAN(dVar5))) {
                  dVar6 = (double)*(uint *)((long)v + (long)(local_f4 + bs * local_f8) * 4);
                  if ((dVar6 != 0.0) || (NAN(dVar6))) {
                    auVar7._8_4_ = (int)(n >> 0x20);
                    auVar7._0_8_ = n;
                    auVar7._12_4_ = 0x45300000;
                    dVar5 = log2((((auVar7._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0)) *
                                 dVar6) / (dVar4 * dVar5));
                    *(double *)(stimulus_local + (long)local_f4 * 2) =
                         dVar6 * dVar5 + *(double *)(stimulus_local + (long)local_f4 * 2);
                  }
                }
              }
              *(double *)(stimulus_local + (long)local_f4 * 2) =
                   *(double *)(stimulus_local + (long)local_f4 * 2) / dVar4;
            }
          }
          gvector_free(v);
          gvector_free(series);
        }
      }
    }
  }
  return (double *)stimulus_local;
}

Assistant:

static double *specific_info(int const *stimulus, int const *responses,
        size_t l, size_t n, int bs, int const *br, size_t const *source,
        inform_dist const *s_dist, inform_error *err)
{
    size_t const u = gvector_len(source);

    int *box = gvector_alloc((u + 1) * n, (u + 1) * n, sizeof(int));
    if (box == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    for (size_t i = 0; i < u; ++i)
    {
        memcpy(box + i*n, responses + source[i]*n, n*sizeof(int));
    }
    inform_black_box(box, u, 1, n, br, NULL, NULL, box + u*n, err);
    if (inform_failed(err))
    {
        gvector_free(box);
        return NULL;
    }
    responses = box + u*n;
    int b = 1;
    for (size_t i = 0; i < u; ++i) b *= br[source[i]];

    size_t const j_size = bs * b;
    size_t const r_size = b;
    size_t const total_size = j_size + r_size;

    uint32_t *data = gvector_alloc(total_size, total_size, sizeof(uint32_t));
    if (data == NULL)
    {
        gvector_free(box);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    for (size_t i = 0; i < total_size; ++i) data[i] = 0;

    inform_dist j_dist = { data, j_size, n };
    inform_dist r_dist = { data + j_size, r_size, n };
    for (size_t i = 0; i < n; ++i)
    {
        r_dist.histogram[responses[i]]++;
        j_dist.histogram[stimulus[i] + bs * responses[i]]++;
    }

    double *si = gvector_alloc(bs, bs, sizeof(double));
    if (si == NULL)
    {
        gvector_free(data);
        gvector_free(box);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    int joint;
    double n_stimulus, n_response, n_joint;
    for (int s = 0; s < bs; ++s)
    {
        si[s] = 0.0;
        n_stimulus = s_dist->histogram[s];
        if (n_stimulus == 0)
        {
            continue;
        }
        for (int r = 0; r < b; ++r)
        {
            n_response = r_dist.histogram[r];
            if (n_response == 0)
            {
                continue;
            }
            joint = s + bs * r;
            n_joint = j_dist.histogram[joint];
            if (n_joint == 0)
            {
                continue;
            }
            si[s] += n_joint * log2((n * n_joint) / (n_stimulus * n_response));
        }
        si[s] /= n_stimulus;
    }

    gvector_free(data);
    gvector_free(box);
    return si;
}